

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

void Kit_TruthSwapAdjacentVars(uint *pOut,uint *pIn,int nVars,int iVar)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int Shift;
  int Step;
  int k;
  int i;
  int nWords;
  int iVar_local;
  int nVars_local;
  uint *pIn_local;
  uint *pOut_local;
  
  iVar1 = Kit_TruthWordNum(nVars);
  if (nVars + -1 <= iVar) {
    __assert_fail("iVar < nVars - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitTruth.c"
                  ,0x39,"void Kit_TruthSwapAdjacentVars(unsigned int *, unsigned int *, int, int)");
  }
  if (iVar < 4) {
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      bVar3 = (byte)(1 << ((byte)iVar & 0x1f));
      pOut[Step] = pIn[Step] & Kit_TruthSwapAdjacentVars::PMasks[iVar][0] |
                   (pIn[Step] & Kit_TruthSwapAdjacentVars::PMasks[iVar][1]) << (bVar3 & 0x1f) |
                   (pIn[Step] & Kit_TruthSwapAdjacentVars::PMasks[iVar][2]) >> (bVar3 & 0x1f);
    }
  }
  else if (iVar < 5) {
    for (Step = 0; Step < iVar1; Step = Step + 2) {
      pOut[Step] = pIn[Step] & 0xffff | pIn[Step + 1] << 0x10;
      pOut[Step + 1] = pIn[Step + 1] & 0xffff0000 | pIn[Step] >> 0x10;
    }
  }
  else {
    iVar2 = 1 << ((byte)iVar - 5 & 0x1f);
    _iVar_local = pIn;
    pIn_local = pOut;
    for (Shift = 0; Shift < iVar1; Shift = iVar2 * 4 + Shift) {
      for (Step = 0; Step < iVar2; Step = Step + 1) {
        pIn_local[Step] = _iVar_local[Step];
      }
      for (Step = 0; Step < iVar2; Step = Step + 1) {
        pIn_local[iVar2 + Step] = _iVar_local[iVar2 * 2 + Step];
      }
      for (Step = 0; Step < iVar2; Step = Step + 1) {
        pIn_local[iVar2 * 2 + Step] = _iVar_local[iVar2 + Step];
      }
      for (Step = 0; Step < iVar2; Step = Step + 1) {
        pIn_local[iVar2 * 3 + Step] = _iVar_local[iVar2 * 3 + Step];
      }
      _iVar_local = _iVar_local + (iVar2 << 2);
      pIn_local = pIn_local + (iVar2 << 2);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Swaps two adjacent variables in the truth table.]

  Description [Swaps var number Start and var number Start+1 (0-based numbers).
  The input truth table is pIn. The output truth table is pOut.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Kit_TruthSwapAdjacentVars( unsigned * pOut, unsigned * pIn, int nVars, int iVar )
{
    static unsigned PMasks[4][3] = {
        { 0x99999999, 0x22222222, 0x44444444 },
        { 0xC3C3C3C3, 0x0C0C0C0C, 0x30303030 },
        { 0xF00FF00F, 0x00F000F0, 0x0F000F00 },
        { 0xFF0000FF, 0x0000FF00, 0x00FF0000 }
    };
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step, Shift;

    assert( iVar < nVars - 1 );
    if ( iVar < 4 )
    {
        Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & PMasks[iVar][0]) | ((pIn[i] & PMasks[iVar][1]) << Shift) | ((pIn[i] & PMasks[iVar][2]) >> Shift);
    }
    else if ( iVar > 4 )
    {
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 4*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pIn[i];
            for ( i = 0; i < Step; i++ )
                pOut[Step+i] = pIn[2*Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[2*Step+i] = pIn[Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[3*Step+i] = pIn[3*Step+i];
            pIn  += 4*Step;
            pOut += 4*Step;
        }
    }
    else // if ( iVar == 4 )
    {
        for ( i = 0; i < nWords; i += 2 )
        {
            pOut[i]   = (pIn[i]   & 0x0000FFFF) | ((pIn[i+1] & 0x0000FFFF) << 16);
            pOut[i+1] = (pIn[i+1] & 0xFFFF0000) | ((pIn[i]   & 0xFFFF0000) >> 16);
        }
    }
}